

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

double __thiscall despot::Logger::StderrUndiscountedRoundReward(Logger *this)

{
  pointer pdVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  int i;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  
  pdVar1 = (this->undiscounted_round_rewards_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->undiscounted_round_rewards_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)pdVar1 >> 3;
  dVar6 = 0.0;
  dVar9 = 0.0;
  for (lVar5 = 0; lVar4 != lVar5; lVar5 = lVar5 + 1) {
    dVar10 = pdVar1[lVar5];
    dVar9 = dVar9 + dVar10;
    dVar6 = dVar6 + dVar10 * dVar10;
  }
  iVar3 = (int)lVar4;
  if (0 < iVar3) {
    dVar10 = (double)iVar3;
    auVar7._8_8_ = (dVar9 * dVar9) / dVar10;
    auVar7._0_8_ = dVar6;
    auVar8._8_8_ = dVar10;
    auVar8._0_8_ = dVar10;
    auVar8 = divpd(auVar7,auVar8);
    auVar2._8_8_ = dVar10;
    auVar2._0_8_ = dVar10;
    auVar8 = divpd(auVar8,auVar2);
    dVar6 = auVar8._0_8_ - auVar8._8_8_;
    if (0.0 <= dVar6) {
      return SQRT(dVar6);
    }
    dVar6 = sqrt(dVar6);
    return dVar6;
  }
  return 0.0;
}

Assistant:

double Logger::StderrUndiscountedRoundReward() const {
	double sum = 0, sum2 = 0;
	for (int i = 0; i < undiscounted_round_rewards_.size(); i++) {
		double reward = undiscounted_round_rewards_[i];
		sum += reward;
		sum2 += reward * reward;
	}
	int n = undiscounted_round_rewards_.size();
	return n > 0 ? sqrt(sum2 / n / n - sum * sum / n / n / n) : 0.0;
}